

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O1

GLFWvidmode * glfwGetVideoModes(GLFWmonitor *handle,int *count)

{
  GLFWbool GVar1;
  GLFWvidmode *pGVar2;
  
  *count = 0;
  if (_glfw.initialized == 0) {
    pGVar2 = (GLFWvidmode *)0x0;
    _glfwInputError(0x10001,(char *)0x0);
  }
  else {
    GVar1 = refreshVideoModes((_GLFWmonitor *)handle);
    if (GVar1 == 0) {
      pGVar2 = (GLFWvidmode *)0x0;
    }
    else {
      *count = *(int *)(handle + 0xa0);
      pGVar2 = *(GLFWvidmode **)(handle + 0x98);
    }
  }
  return pGVar2;
}

Assistant:

GLFWAPI const GLFWvidmode* glfwGetVideoModes(GLFWmonitor* handle, int* count)
{
    _GLFWmonitor* monitor = (_GLFWmonitor*) handle;
    assert(monitor != NULL);
    assert(count != NULL);

    *count = 0;

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (!refreshVideoModes(monitor))
        return NULL;

    *count = monitor->modeCount;
    return monitor->modes;
}